

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O0

void __thiscall spdlog::details::file_helper::sync(file_helper *this)

{
  uint uVar1;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  string *in_stack_ffffffffffffffb0;
  filename_t local_48 [2];
  file_helper *local_8;
  
  local_8 = this;
  uVar1 = details::os::fsync((int)this->fd_);
  if ((uVar1 & 1) == 0) {
    details::os::filename_to_str(local_48);
    std::operator+((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    __errno_location();
    throw_spdlog_ex(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  return;
}

Assistant:

SPDLOG_INLINE void file_helper::sync() {
    if (!os::fsync(fd_)) {
        throw_spdlog_ex("Failed to fsync file " + os::filename_to_str(filename_), errno);
    }
}